

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

uint32_t spvtools::anon_unknown_0::GetLineLengthWithoutColor(string *line)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  ulong local_20;
  size_t i;
  uint32_t length;
  string *line_local;
  
  i._4_4_ = 0;
  for (local_20 = 0; uVar1 = std::__cxx11::string::size(), local_20 < uVar1; local_20 = local_20 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
    if (*pcVar2 == '\x1b') {
      do {
        local_20 = local_20 + 1;
        uVar1 = std::__cxx11::string::size();
        bVar3 = false;
        if (local_20 < uVar1) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
          bVar3 = *pcVar2 != 'm';
        }
      } while (bVar3);
    }
    else {
      i._4_4_ = i._4_4_ + 1;
    }
  }
  return i._4_4_;
}

Assistant:

uint32_t GetLineLengthWithoutColor(const std::string line) {
  // Currently, every added color is in the form \x1b...m, so instead of doing a
  // lot of string comparisons with spvtools::clr::* strings, we just ignore
  // those ranges.
  uint32_t length = 0;
  for (size_t i = 0; i < line.size(); ++i) {
    if (line[i] == '\x1b') {
      do {
        ++i;
      } while (i < line.size() && line[i] != 'm');
      continue;
    }

    ++length;
  }

  return length;
}